

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_destroy.c
# Opt level: O1

void ares_destroy_servers_state(ares_channel_t *channel)

{
  ares_slist_node_t *node;
  ares_server_t *server;
  ares_slist_t *list;
  
  list = channel->servers;
  while( true ) {
    node = ares_slist_node_first(list);
    if (node == (ares_slist_node_t *)0x0) break;
    server = (ares_server_t *)ares_slist_node_claim(node);
    ares_destroy_server(server);
    list = channel->servers;
  }
  ares_slist_destroy(channel->servers);
  channel->servers = (ares_slist_t *)0x0;
  return;
}

Assistant:

void ares_destroy_servers_state(ares_channel_t *channel)
{
  ares_slist_node_t *node;

  while ((node = ares_slist_node_first(channel->servers)) != NULL) {
    ares_server_t *server = ares_slist_node_claim(node);
    ares_destroy_server(server);
  }

  ares_slist_destroy(channel->servers);
  channel->servers = NULL;
}